

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall
QMenuPrivate::activateCausedStack
          (QMenuPrivate *this,QList<QPointer<QWidget>_> *causedStack,QAction *action,
          ActionEvent action_e,bool self)

{
  bool bVar1;
  QPointer<QWidget> *pQVar2;
  bool bVar3;
  QMenu *pQVar4;
  QMenuBar *this_00;
  long lVar5;
  QObject *pQVar6;
  undefined3 in_register_00000081;
  int i;
  ulong uVar7;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_58;
  QWeakPointer<QObject> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = *(QMenu **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = this->activationRecursionGuard;
  this->activationRecursionGuard = true;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QMenu>::QPointer<void>((QPointer<QMenu> *)&local_48,pQVar4);
  if (CONCAT31(in_register_00000081,self) != 0) {
    QAction::activate((ActionEvent)action);
  }
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_48);
  if (bVar3) {
    lVar5 = 8;
    for (uVar7 = 0; uVar7 < (ulong)(causedStack->d).size; uVar7 = uVar7 + 1) {
      pQVar2 = (causedStack->d).ptr;
      local_58.d = *(Data **)((long)pQVar2 + lVar5 + -8);
      local_58.value = *(QObject **)((long)&(pQVar2->wp).d + lVar5);
      if (local_58.d != (Data *)0x0) {
        LOCK();
        *(int *)local_58.d = *(int *)local_58.d + 1;
        UNLOCK();
      }
      bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_58);
      if (bVar3) {
        if ((local_58.d == (Data *)0x0) || (pQVar6 = local_58.value, *(int *)(local_58.d + 4) == 0))
        {
          pQVar6 = (QObject *)0x0;
        }
        pQVar4 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(pQVar6);
        if (pQVar4 == (QMenu *)0x0) {
          if ((local_58.d == (Data *)0x0) ||
             (pQVar6 = local_58.value, *(int *)(local_58.d + 4) == 0)) {
            pQVar6 = (QObject *)0x0;
          }
          this_00 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(pQVar6);
          if (this_00 != (QMenuBar *)0x0) {
            if (action_e == Hover) {
              QMenuBar::hovered(this_00,action);
            }
            else if (action_e == Trigger) {
              QMenuBar::triggered(this_00,action);
            }
            QWeakPointer<QObject>::~QWeakPointer(&local_58);
            break;
          }
        }
        else {
          QWeakPointer<QObject>::operator=
                    (&local_58,
                     (QWeakPointer<QObject> *)(*(long *)&(pQVar4->super_QWidget).field_0x8 + 0x2f8))
          ;
          if (action_e == Hover) {
            QMenu::hovered(pQVar4,action);
          }
          else if (action_e == Trigger) {
            QMenu::triggered(pQVar4,action);
          }
        }
      }
      QWeakPointer<QObject>::~QWeakPointer(&local_58);
      lVar5 = lVar5 + 0x10;
    }
    this->activationRecursionGuard = bVar1;
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::activateCausedStack(const QList<QPointer<QWidget>> &causedStack, QAction *action,
                                       QAction::ActionEvent action_e, bool self)
{
    Q_Q(QMenu);
    // can't use QScopedValueRollback here
    const bool activationRecursionGuardReset = activationRecursionGuard;
    activationRecursionGuard = true;
    QPointer<QMenu> guard(q);
    if (self)
        action->activate(action_e);
    if (!guard)
        return;
    auto boolBlocker = qScopeGuard([this, activationRecursionGuardReset]{
        activationRecursionGuard = activationRecursionGuardReset;
    });

    for(int i = 0; i < causedStack.size(); ++i) {
        QPointer<QWidget> widget = causedStack.at(i);
        if (!widget)
            continue;
        //fire
        if (QMenu *qmenu = qobject_cast<QMenu*>(widget)) {
            widget = qmenu->d_func()->causedPopup.widget;
            if (action_e == QAction::Trigger) {
                emit qmenu->triggered(action);
           } else if (action_e == QAction::Hover) {
                emit qmenu->hovered(action);
            }
#if QT_CONFIG(menubar)
        } else if (QMenuBar *qmenubar = qobject_cast<QMenuBar*>(widget)) {
            if (action_e == QAction::Trigger) {
                emit qmenubar->triggered(action);
            } else if (action_e == QAction::Hover) {
                emit qmenubar->hovered(action);
            }
            break; //nothing more..
#endif
        }
    }
}